

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::SectionParser::parse(SectionParser *this,istream *input,ForceField *ff,int lineNo)

{
  bool bVar1;
  byte bVar2;
  long *plVar3;
  uint uVar4;
  SectionParser *this_00;
  string line;
  string filteredLine;
  char buffer [65535];
  allocator<char> aStack_100d9;
  SectionParser *pSStack_100d8;
  ForceField *pFStack_100d0;
  istream *piStack_100c8;
  locale alStack_100c0 [8];
  undefined1 auStack_100b8 [40];
  undefined8 uStack_10090;
  undefined1 auStack_10088 [16];
  string sStack_10078;
  string sStack_10058;
  char acStack_10038 [65544];
  
  auStack_100b8._0_8_ = auStack_100b8 + 0x10;
  auStack_100b8._8_8_ = (pointer)0x0;
  auStack_100b8[0x10] = 0;
  auStack_100b8._32_8_ = auStack_10088;
  uStack_10090 = 0;
  auStack_10088[0] = 0;
  uVar4 = lineNo + 1;
  pSStack_100d8 = this;
  pFStack_100d0 = ff;
  piStack_100c8 = input;
  while (plVar3 = (long *)std::istream::getline((char *)piStack_100c8,(long)acStack_10038),
        (*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_10078,acStack_10038,&aStack_100d9);
    std::locale::locale(alStack_100c0);
    Utils::trimLeftCopy(&sStack_10058,&sStack_10078,alStack_100c0);
    std::__cxx11::string::operator=((string *)auStack_100b8,(string *)&sStack_10058);
    std::__cxx11::string::~string((string *)&sStack_10058);
    std::locale::~locale(alStack_100c0);
    std::__cxx11::string::~string((string *)&sStack_10078);
    this_00 = (SectionParser *)auStack_100b8;
    bVar1 = isEndSection(pSStack_100d8,(string *)auStack_100b8);
    if (bVar1) break;
    if ((pointer)auStack_100b8._8_8_ != (pointer)0x0) {
      if ((pointer)auStack_100b8._8_8_ == (pointer)0x1) {
        bVar2 = *(byte *)auStack_100b8._0_8_;
LAB_001d5d99:
        if ((bVar2 | 2) == 0x23) goto LAB_001d5de2;
      }
      else {
        bVar2 = *(byte *)auStack_100b8._0_8_;
        if (bVar2 != 0x2f) goto LAB_001d5d99;
        if (*(byte *)(auStack_100b8._0_8_ + 1) == 0x2f) goto LAB_001d5de2;
      }
      stripComments(&sStack_10058,this_00,(string *)auStack_100b8);
      std::__cxx11::string::operator=((string *)(auStack_100b8 + 0x20),(string *)&sStack_10058);
      std::__cxx11::string::~string((string *)&sStack_10058);
      (*pSStack_100d8->_vptr_SectionParser[3])
                (pSStack_100d8,pFStack_100d0,(string *)(auStack_100b8 + 0x20),(ulong)uVar4);
    }
LAB_001d5de2:
    uVar4 = uVar4 + 1;
  }
  std::__cxx11::string::~string((string *)(auStack_100b8 + 0x20));
  std::__cxx11::string::~string((string *)auStack_100b8);
  return;
}

Assistant:

void SectionParser::parse(std::istream& input, ForceField& ff, int lineNo) {
    const int bufferSize = 65535;
    char buffer[bufferSize];
    std::string line, filteredLine;
    while (input.getline(buffer, bufferSize)) {
      ++lineNo;
      line = Utils::trimLeftCopy(buffer);
      // a line begins with "//" is comment
      // let's also call lines starting with # and ! as comments
      if (isEndSection(line)) {
        break;
      } else if (line.empty() ||
                 (line.size() >= 2 && line[0] == '/' && line[1] == '/') ||
                 (line.size() >= 1 && line[0] == '#') ||
                 (line.size() >= 1 && line[0] == '!')) {
        continue;
      } else {
        filteredLine = stripComments(line);
        parseLine(ff, filteredLine, lineNo);
      }
    }
  }